

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

int __thiscall ncnn::Layer_final::create_pipeline(Layer_final *this,Option *opt)

{
  int iVar1;
  
  set_layer_properties(this);
  iVar1 = (*this->layer_cpu->_vptr_Layer[4])(this->layer_cpu,opt);
  get_layer_properties(this);
  return iVar1;
}

Assistant:

virtual int create_pipeline(const Option& opt)
    {
        set_layer_properties();
#if NCNN_VULKAN
        if (layer_vulkan)
        {
            if (vkdev)
            {
                int ret = layer_vulkan->create_pipeline(opt);
                get_layer_properties();
                return ret;
            }

            // fallback to cpu layer
            delete layer_vulkan;
            layer_vulkan = 0;
        }
#endif // NCNN_VULKAN

        int ret = layer_cpu->create_pipeline(opt);
        get_layer_properties();
        return ret;
    }